

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O3

void __thiscall
google::protobuf::internal::ExtensionSet::InternalMergeFromSlow
          (ExtensionSet *this,MessageLite *extendee,ExtensionSet *other)

{
  uint16_t uVar1;
  KeyValue *pKVar2;
  KeyValue *pKVar3;
  ulong uVar4;
  uint uVar5;
  KeyValue *pKVar6;
  size_t minimum_new_capacity;
  KeyValue *pKVar7;
  KeyValue *pKVar8;
  long lVar9;
  long lVar10;
  bool bVar11;
  iterator iVar12;
  iterator iVar13;
  btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>,_std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_&,_std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_*>
  it_source;
  btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>,_std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_&,_std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_*>
  end_source;
  
  minimum_new_capacity = (size_t)(short)this->flat_size_;
  if (-1 < (long)minimum_new_capacity) {
    uVar1 = other->flat_size_;
    pKVar8 = (this->map_).flat;
    pKVar6 = pKVar8 + minimum_new_capacity;
    pKVar7 = (other->map_).flat;
    if ((long)(short)uVar1 < 0) {
      iVar12 = absl::lts_20250127::container_internal::
               btree<absl::lts_20250127::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>
               ::begin((btree<absl::lts_20250127::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>
                        *)pKVar7);
      iVar13 = absl::lts_20250127::container_internal::
               btree<absl::lts_20250127::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>
               ::end((btree<absl::lts_20250127::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>
                      *)(other->map_).flat);
      it_source._12_4_ = 0;
      it_source.node_ =
           (btree_node<absl::lts_20250127::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>
            *)SUB128(iVar12._0_12_,0);
      it_source.position_ = SUB124(iVar12._0_12_,8);
      end_source._12_4_ = 0;
      end_source.node_ =
           (btree_node<absl::lts_20250127::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>
            *)SUB128(iVar13._0_12_,0);
      end_source.position_ = SUB124(iVar13._0_12_,8);
      minimum_new_capacity =
           internal::(anonymous_namespace)::
           SizeOfUnion<google::protobuf::internal::ExtensionSet::KeyValue*,absl::lts_20250127::container_internal::btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,google::protobuf::internal::ExtensionSet::Extension,std::less<int>,std::allocator<std::pair<int_const,google::protobuf::internal::ExtensionSet::Extension>>,256,false>>,std::pair<int_const,google::protobuf::internal::ExtensionSet::Extension>&,std::pair<int_const,google::protobuf::internal::ExtensionSet::Extension>*>>
                     (pKVar8,pKVar6,it_source,end_source);
    }
    else if (uVar1 != 0) {
      pKVar2 = pKVar7 + (short)uVar1;
      do {
        pKVar3 = pKVar6;
        if (pKVar8 != pKVar6) {
          do {
            if (pKVar7->first <= pKVar8->first) {
              pKVar3 = pKVar8;
              if (pKVar8->first <= pKVar7->first) {
                uVar4 = 0;
                goto LAB_00138373;
              }
              break;
            }
            pKVar8 = pKVar8 + 1;
          } while (pKVar8 != pKVar6);
        }
        uVar4 = (ulong)(((pKVar7->second).field_0xa & 2) == 0);
        pKVar8 = pKVar3;
LAB_00138373:
        minimum_new_capacity = minimum_new_capacity + uVar4;
        pKVar7 = pKVar7 + 1;
      } while (pKVar7 != pKVar2);
    }
    GrowCapacity(this,minimum_new_capacity);
  }
  lVar9 = (long)(short)other->flat_size_;
  pKVar8 = (other->map_).flat;
  if (lVar9 < 0) {
    iVar12 = absl::lts_20250127::container_internal::
             btree<absl::lts_20250127::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>
             ::begin((btree<absl::lts_20250127::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>
                      *)pKVar8);
    iVar13 = absl::lts_20250127::container_internal::
             btree<absl::lts_20250127::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>
             ::end((btree<absl::lts_20250127::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>
                    *)(other->map_).flat);
    ForEachPrefetchImpl<absl::lts_20250127::container_internal::btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,google::protobuf::internal::ExtensionSet::Extension,std::less<int>,std::allocator<std::pair<int_const,google::protobuf::internal::ExtensionSet::Extension>>,256,false>>,std::pair<int_const,google::protobuf::internal::ExtensionSet::Extension>&,std::pair<int_const,google::protobuf::internal::ExtensionSet::Extension>*>,google::protobuf::internal::ExtensionSet::InternalMergeFromSlow(google::protobuf::MessageLite_const*,google::protobuf::internal::ExtensionSet_const&)::__0,google::protobuf::internal::ExtensionSet::Prefetch>
              (iVar12.node_,iVar12.position_,iVar13.node_,iVar13._8_8_ & 0xffffffff);
  }
  else {
    lVar10 = lVar9 * 0x20;
    pKVar7 = pKVar8 + lVar9;
    pKVar6 = pKVar8;
    if (other->flat_size_ != 0) {
      uVar5 = 0;
      do {
        lVar10 = lVar10 + -0x20;
        Extension::PrefetchPtr(&pKVar6->second);
        pKVar6 = pKVar6 + 1;
        if (lVar10 == 0) break;
        bVar11 = uVar5 < 0xf;
        uVar5 = uVar5 + 1;
      } while (bVar11);
    }
    for (; pKVar6 != pKVar7; pKVar6 = pKVar6 + 1) {
      InternalExtensionMergeFrom(this,extendee,pKVar8->first,&pKVar8->second,other->arena_);
      Extension::PrefetchPtr(&pKVar6->second);
      pKVar8 = pKVar8 + 1;
    }
    for (; pKVar8 != pKVar7; pKVar8 = pKVar8 + 1) {
      InternalExtensionMergeFrom(this,extendee,pKVar8->first,&pKVar8->second,other->arena_);
    }
  }
  return;
}

Assistant:

void ExtensionSet::InternalMergeFromSlow(const MessageLite* extendee,
                                         const ExtensionSet& other) {
  if (ABSL_PREDICT_TRUE(!is_large())) {
    if (ABSL_PREDICT_TRUE(!other.is_large())) {
      GrowCapacity(SizeOfUnion(flat_begin(), flat_end(), other.flat_begin(),
                               other.flat_end()));
    } else {
      GrowCapacity(SizeOfUnion(flat_begin(), flat_end(),
                               other.map_.large->begin(),
                               other.map_.large->end()));
    }
  }
  other.ForEach(
      [extendee, this, &other](int number, const Extension& ext) {
        this->InternalExtensionMergeFrom(extendee, number, ext, other.arena_);
      },
      Prefetch{});
}